

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamToolsIndex::ReadReferenceEntry
          (BamToolsIndex *this,BtiReferenceEntry *refEntry)

{
  pointer pBVar1;
  BamException *this_00;
  ulong uVar2;
  ulong uVar3;
  string local_68;
  string local_48;
  
  uVar3 = (ulong)refEntry->ID;
  if (-1 < (long)uVar3) {
    pBVar1 = (this->m_indexFileSummary).
             super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = (long)(this->m_indexFileSummary).
                  super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 4;
    if (refEntry->ID < (int)uVar2) {
      if (uVar3 < uVar2) {
        ReadBlocks(this,pBVar1 + uVar3,&refEntry->Blocks);
        return;
      }
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"BamToolsIndex::ReadReferenceEntry","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"invalid reference requested","");
  BamException::BamException(this_00,&local_68,&local_48);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamToolsIndex::ReadReferenceEntry(BtiReferenceEntry& refEntry) {

    // return false if refId not valid index in file summary structure
    if ( refEntry.ID < 0 || refEntry.ID >= (int)m_indexFileSummary.size() )
        throw BamException("BamToolsIndex::ReadReferenceEntry", "invalid reference requested");

    // use index summary to assist reading the reference's BTI blocks
    const BtiReferenceSummary& refSummary = m_indexFileSummary.at(refEntry.ID);
    ReadBlocks(refSummary, refEntry.Blocks);
}